

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSat.c
# Opt level: O2

void Ssc_ManCollectSatPattern(Ssc_Man_t *p,Vec_Int_t *vPattern)

{
  sat_solver *psVar1;
  int iObj;
  uint uVar2;
  Gia_Obj_t *pObj;
  int v;
  
  vPattern->nSize = 0;
  v = 0;
  while( true ) {
    if (p->pFraig->vCis->nSize <= v) {
      return;
    }
    pObj = Gia_ManCi(p->pFraig,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    psVar1 = p->pSat;
    iObj = Gia_ObjId(p->pFraig,pObj);
    uVar2 = Ssc_ObjSatVar(p,iObj);
    if (((int)uVar2 < 0) || (psVar1->size <= (int)uVar2)) {
      __assert_fail("v >= 0 && v < s->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                    ,0xda,"int sat_solver_var_value(sat_solver *, int)");
    }
    Vec_IntPush(vPattern,(uint)(psVar1->model[uVar2] == 1));
    v = v + 1;
  }
  return;
}

Assistant:

void Ssc_ManCollectSatPattern( Ssc_Man_t * p, Vec_Int_t * vPattern )
{
    Gia_Obj_t * pObj;
    int i;
    Vec_IntClear( vPattern );
    Gia_ManForEachCi( p->pFraig, pObj, i )
        Vec_IntPush( vPattern, sat_solver_var_value(p->pSat, Ssc_ObjSatVar(p, Gia_ObjId(p->pFraig, pObj))) );
}